

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall google::protobuf::compiler::Parser::TryConsume(Parser *this,string_view text)

{
  Tokenizer *this_00;
  bool bVar1;
  int iVar2;
  size_t __n;
  
  __n = text._M_len;
  this_00 = this->input_;
  if ((this_00->current_).text._M_string_length == __n) {
    if (__n != 0) {
      iVar2 = bcmp((this_00->current_).text._M_dataplus._M_p,text._M_str,__n);
      if (iVar2 != 0) goto LAB_0037bce9;
    }
    io::Tokenizer::Next(this_00);
    bVar1 = true;
  }
  else {
LAB_0037bce9:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool Parser::LookingAt(absl::string_view text) {
  return input_->current().text == text;
}